

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

bool __thiscall pbrt::IPCChannel::Send(IPCChannel *this,span<const_unsigned_char> message)

{
  bool bVar1;
  undefined4 level;
  uchar *puVar2;
  size_t sVar3;
  ssize_t sVar4;
  size_t sVar5;
  IPCChannel *in_RDI;
  IPCChannel *in_stack_00000058;
  int bytesSent;
  int *startPtr;
  IPCChannel *in_stack_ffffffffffffff70;
  socket_t __fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  span<const_unsigned_char> local_18;
  bool local_1;
  
  bVar1 = Connected(in_RDI);
  if (!bVar1) {
    Connect(in_stack_00000058);
    bVar1 = Connected(in_RDI);
    if (!bVar1) {
      return false;
    }
  }
  puVar2 = pstd::span<const_unsigned_char>::data(&local_18);
  sVar3 = pstd::span<const_unsigned_char>::size(&local_18);
  *(int *)puVar2 = (int)sVar3;
  __fd = in_RDI->socketFd;
  puVar2 = pstd::span<const_unsigned_char>::data(&local_18);
  sVar3 = pstd::span<const_unsigned_char>::size(&local_18);
  sVar4 = send(__fd,puVar2,sVar3,0);
  level = (undefined4)sVar4;
  sVar3 = (size_t)(int)level;
  sVar5 = pstd::span<const_unsigned_char>::size(&local_18);
  if (sVar3 == sVar5) {
    local_1 = true;
  }
  else {
    if (LOGGING_LogLevel < 2) {
      LastError();
      in_stack_ffffffffffffff70 = (IPCChannel *)&stack0xffffffffffffffb0;
      ErrorString_abi_cxx11_(__fd);
      Log<std::__cxx11::string>
                (level,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                 in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    }
    Disconnect(in_stack_ffffffffffffff70);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IPCChannel::Send(pstd::span<const uint8_t> message) {
    if (!Connected()) {
        Connect();
        if (!Connected())
            return false;
    }

    // Start with the length of the message.
    // FIXME: annoying coupling w/sending code's message buffer layout...
    int *startPtr = (int *)message.data();
    *startPtr = message.size();

    int bytesSent = send(socketFd, (const char *)message.data(), message.size(), 0 /* flags */);
    if (bytesSent == message.size())
        return true;

    LOG_ERROR("send to display server failed: %s", ErrorString());
    Disconnect();
    return false;
}